

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

bool Is11SectorTrack(Track *track)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  pointer this;
  
  iVar3 = Track::size(track);
  if (iVar3 == 0xb) {
    this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (this == pSVar1) {
        if (opt.debug != 0) {
          util::operator<<((LogHelper *)&util::cout,
                           (char (*) [32])"detected 11-sector tight track\n");
          return true;
        }
        return true;
      }
      if (this->datarate != _250K) {
        return false;
      }
      if (this->encoding != MFM) {
        return false;
      }
      iVar3 = Sector::size(this);
      if (iVar3 != 0x200) {
        return false;
      }
      bVar2 = Sector::has_good_data(this);
      this = this + 1;
    } while (bVar2);
  }
  return false;
}

Assistant:

bool Is11SectorTrack(const Track& track)
{
    if (track.size() != 11)
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.size() != 512 || !s.has_good_data())
        {
            return false;
        }
    }

    if (opt.debug) util::cout << "detected 11-sector tight track\n";
    return true;
}